

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O1

vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> * __thiscall
dg::vr::StructureAnalyzer::getRelevantConditions
          (vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
           *__return_storage_ptr__,StructureAnalyzer *this,VRAssumeBool *assume)

{
  PHINode **ppPVar1;
  Value *pVVar2;
  pointer ppVVar3;
  pointer ppIVar4;
  pointer ppVVar5;
  PHINode *pPVar6;
  vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_> to_process;
  vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> result;
  PHINode *phi;
  ICmpInst *icmp;
  PHINode **local_98;
  iterator iStack_90;
  PHINode **local_88;
  pointer local_78;
  iterator iStack_70;
  pointer local_68;
  vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> local_58;
  PHINode *local_40;
  PHINode *local_38;
  
  pVVar2 = (assume->super_VRAssume).val;
  if ((pVVar2 == (Value *)0x0) || (pVVar2[0x10] != (Value)0x50)) {
    pVVar2 = (assume->super_VRAssume).val;
    if ((pVVar2 == (Value *)0x0) || (pVVar2[0x10] != (Value)0x52)) {
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      local_78 = (pointer)0x0;
      iStack_70._M_current = (pointer)0x0;
      local_68 = (pointer)0x0;
      local_88 = (PHINode **)0x0;
      local_98 = (PHINode **)0x0;
      iStack_90._M_current = (PHINode **)0x0;
      local_98 = (PHINode **)operator_new(8);
      iStack_90._M_current = local_98 + 1;
      *local_98 = (PHINode *)pVVar2;
      local_88 = iStack_90._M_current;
      if (local_98 != iStack_90._M_current) {
        do {
          ppPVar1 = iStack_90._M_current + -1;
          iStack_90._M_current = iStack_90._M_current + -1;
          possibleSources(&local_58,this,*ppPVar1,assume->assumption);
          ppVVar3 = local_58.
                    super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVVar5 = local_58.
                         super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppVVar5 != ppVVar3;
              ppVVar5 = ppVVar5 + 1) {
            pPVar6 = (PHINode *)
                     ((*ppVVar5)->op)._M_t.
                     super___uniq_ptr_impl<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>._M_t.
                     super__Tuple_impl<0UL,_dg::vr::VROp_*,_std::default_delete<dg::vr::VROp>_>.
                     super__Head_base<0UL,_dg::vr::VROp_*,_false>._M_head_impl[1]._vptr_VROp;
            local_38 = pPVar6;
            if (pPVar6[0x10] != (PHINode)0x50) {
              local_38 = (PHINode *)0x0;
            }
            if (local_38 == (PHINode *)0x0) {
              if (pPVar6[0x10] != (PHINode)0x52) {
                pPVar6 = (PHINode *)0x0;
              }
              local_40 = pPVar6;
              if (pPVar6 == (PHINode *)0x0) {
                (__return_storage_ptr__->
                super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (__return_storage_ptr__->
                super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (__return_storage_ptr__->
                super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              }
              else if (iStack_90._M_current == local_88) {
                std::vector<llvm::PHINode_const*,std::allocator<llvm::PHINode_const*>>::
                _M_realloc_insert<llvm::PHINode_const*&>
                          ((vector<llvm::PHINode_const*,std::allocator<llvm::PHINode_const*>> *)
                           &local_98,iStack_90,&local_40);
              }
              else {
                *iStack_90._M_current = pPVar6;
                iStack_90._M_current = iStack_90._M_current + 1;
              }
              if (pPVar6 == (PHINode *)0x0) {
                if (local_58.
                    super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_58.
                                  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_58.
                                        super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_58.
                                        super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                goto LAB_001280a3;
              }
            }
            else if (iStack_70._M_current == local_68) {
              std::vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>>::
              _M_realloc_insert<llvm::ICmpInst_const*&>
                        ((vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>> *)
                         &local_78,iStack_70,(ICmpInst **)&local_38);
            }
            else {
              *iStack_70._M_current = (ICmpInst *)local_38;
              iStack_70._M_current = iStack_70._M_current + 1;
            }
          }
          if (local_58.
              super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.
                            super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_58.
                                  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.
                                  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        } while (local_98 != iStack_90._M_current);
      }
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_start = local_78;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = iStack_70._M_current;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_68;
      local_78 = (pointer)0x0;
      iStack_70._M_current = (ICmpInst **)0x0;
      local_68 = (pointer)0x0;
LAB_001280a3:
      if (local_98 != (PHINode **)0x0) {
        operator_delete(local_98,(long)local_88 - (long)local_98);
      }
      if (local_78 != (pointer)0x0) {
        operator_delete(local_78,(long)local_68 - (long)local_78);
      }
    }
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppIVar4 = (pointer)operator_new(8);
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_start = ppIVar4;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppIVar4 + 1;
    *ppIVar4 = (ICmpInst *)pVVar2;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppIVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const llvm::ICmpInst *>
StructureAnalyzer::getRelevantConditions(const VRAssumeBool *assume) const {
    if (const auto *icmp = llvm::dyn_cast<llvm::ICmpInst>(assume->getValue()))
        return {icmp};

    const auto *phi = llvm::dyn_cast<llvm::PHINode>(assume->getValue());
    if (!phi)
        return {};

    std::vector<const llvm::ICmpInst *> result;
    std::vector<const llvm::PHINode *> to_process{phi};

    while (!to_process.empty()) {
        const auto *phi = to_process.back();
        to_process.pop_back();

        for (const auto *sourceEdge :
             possibleSources(phi, assume->getAssumption())) {
            assert(sourceEdge->op->isInstruction());
            const llvm::Instruction *inst =
                    static_cast<const VRInstruction *>(sourceEdge->op.get())
                            ->getInstruction();
            if (const auto *icmp = llvm::dyn_cast<llvm::ICmpInst>(inst))
                result.emplace_back(icmp);
            else if (const auto *phi = llvm::dyn_cast<llvm::PHINode>(inst))
                to_process.emplace_back(phi);
            else
                return {};
        }
    }
    return result;
}